

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::UCharsTrieBuilder::UCTLinearMatchNode::operator==(UCTLinearMatchNode *this,Node *other)

{
  UBool UVar1;
  int32_t iVar2;
  UCTLinearMatchNode *o;
  Node *other_local;
  UCTLinearMatchNode *this_local;
  
  if (this == (UCTLinearMatchNode *)other) {
    this_local._7_1_ = true;
  }
  else {
    UVar1 = StringTrieBuilder::LinearMatchNode::operator==(&this->super_LinearMatchNode,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = false;
    }
    else {
      iVar2 = u_memcmp_63(this->s,*(UChar **)&other[2].hash,(this->super_LinearMatchNode).length);
      this_local._7_1_ = iVar2 == 0;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
UCharsTrieBuilder::UCTLinearMatchNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!LinearMatchNode::operator==(other)) {
        return FALSE;
    }
    const UCTLinearMatchNode &o=(const UCTLinearMatchNode &)other;
    return 0==u_memcmp(s, o.s, length);
}